

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O1

void __thiscall
QScroller::ensureVisible(QScroller *this,QRectF *rect,qreal xmargin,qreal ymargin,int scrollTime)

{
  QScrollerPrivate *this_00;
  long lVar1;
  double dVar2;
  qreal qVar3;
  QDebug this_01;
  undefined8 uVar4;
  bool bVar5;
  char cVar6;
  long in_FS_OFFSET;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QPointF local_f8;
  QPointF local_e8;
  undefined4 uStack_d8;
  undefined4 local_d4;
  char *local_d0;
  QDebug local_c0;
  undefined1 local_b8 [24];
  qreal qStack_a0;
  double local_98;
  double dStack_90;
  QPointF local_88;
  double local_78;
  double dStack_70;
  QPointF local_68;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->d_ptr;
  if (this_00->state - Pressed < 2) goto LAB_00663bc1;
  if (this_00->state == Inactive) {
    local_88.xp = 0.0;
    local_88.yp = 0.0;
    bVar5 = QScrollerPrivate::prepareScrolling(this_00,&local_88);
    if (!bVar5) goto LAB_00663bc1;
  }
  lVar1 = (this_00->xSegments).super_QList<QScrollerPrivate::ScrollSegment>.d.size;
  if (lVar1 == 0) {
    local_b8._16_8_ = (this_00->contentPosition).xp + (this_00->overshootPosition).xp;
  }
  else {
    local_b8._16_8_ =
         (this_00->xSegments).super_QList<QScrollerPrivate::ScrollSegment>.d.ptr[lVar1 + -1].stopPos
    ;
  }
  lVar1 = (this_00->ySegments).super_QList<QScrollerPrivate::ScrollSegment>.d.size;
  if (lVar1 == 0) {
    qStack_a0 = (this_00->contentPosition).yp + (this_00->overshootPosition).yp;
  }
  else {
    qStack_a0 = (this_00->ySegments).super_QList<QScrollerPrivate::ScrollSegment>.d.ptr[lVar1 + -1].
                stopPos;
  }
  local_88.yp = rect->yp - ymargin;
  local_88.xp = rect->xp - xmargin;
  local_78 = xmargin + xmargin + rect->w;
  dStack_70 = ymargin + ymargin + rect->h;
  dVar8 = (this_00->viewportSize).wd;
  dVar2 = (this_00->viewportSize).ht;
  local_98 = dVar8;
  dStack_90 = dVar2;
  local_68.xp = (qreal)local_b8._16_8_;
  local_68.yp = qStack_a0;
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_e8.xp._0_4_ = 2;
    local_e8.xp._4_4_ = 0;
    local_e8.yp._0_4_ = 0;
    local_e8.yp._4_4_ = 0;
    uStack_d8 = 0;
    local_d4 = 0;
    local_d0 = lcScroller::category.name;
    QMessageLogger::debug();
    this_01.stream = local_c0.stream;
    QVar13.m_data = (storage_type *)0x19;
    QVar13.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<((QTextStream *)this_01.stream,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_c0.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_c0.stream,' ');
    }
    local_b8._0_8_ = local_c0.stream;
    *(int *)(local_c0.stream + 0x28) = *(int *)(local_c0.stream + 0x28) + 1;
    ::operator<<((Stream *)(local_b8 + 8),(QRectF *)local_b8);
    uVar4 = local_b8._8_8_;
    QVar14.m_data = (storage_type *)0x8;
    QVar14.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<((QTextStream *)uVar4,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_b8._8_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8._8_8_,' ');
    }
    QTextStream::operator<<((QTextStream *)local_b8._8_8_,xmargin);
    if (*(QTextStream *)(local_b8._8_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8._8_8_,' ');
    }
    uVar4 = local_b8._8_8_;
    QVar15.m_data = (storage_type *)0x8;
    QVar15.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar15);
    QTextStream::operator<<((QTextStream *)uVar4,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_b8._8_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8._8_8_,' ');
    }
    QTextStream::operator<<((QTextStream *)local_b8._8_8_,ymargin);
    if (*(QTextStream *)(local_b8._8_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8._8_8_,' ');
    }
    uVar4 = local_b8._8_8_;
    QVar16.m_data = (storage_type *)0x8;
    QVar16.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar16);
    QTextStream::operator<<((QTextStream *)uVar4,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_b8._8_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8._8_8_,' ');
    }
    QTextStream::operator<<((QTextStream *)local_b8._8_8_,scrollTime);
    if (*(QTextStream *)(local_b8._8_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8._8_8_,' ');
    }
    uVar4 = local_b8._8_8_;
    QVar17.m_data = (storage_type *)0x5;
    QVar17.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar17);
    QTextStream::operator<<((QTextStream *)uVar4,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_b8._8_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8._8_8_,' ');
    }
    QDebug::~QDebug((QDebug *)(local_b8 + 8));
    QDebug::~QDebug((QDebug *)local_b8);
    QDebug::~QDebug(&local_c0);
  }
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_e8.xp._0_4_ = 2;
    local_e8.xp._4_4_ = 0;
    local_e8.yp._0_4_ = 0;
    local_e8.yp._4_4_ = 0;
    uStack_d8 = 0;
    local_d4 = 0;
    local_d0 = lcScroller::category.name;
    QMessageLogger::debug();
    uVar4 = local_b8._8_8_;
    QVar18.m_data = (storage_type *)0x17;
    QVar18.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar18);
    QTextStream::operator<<((QTextStream *)uVar4,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_b8._8_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8._8_8_,' ');
    }
    local_f8.xp = (qreal)local_b8._8_8_;
    *(int *)(local_b8._8_8_ + 0x28) = *(int *)(local_b8._8_8_ + 0x28) + 1;
    ::operator<<((QDebug)&local_f8.yp,&local_f8);
    QDebug::~QDebug((QDebug *)&local_f8.yp);
    QDebug::~QDebug((QDebug *)&local_f8);
    QDebug::~QDebug((QDebug *)(local_b8 + 8));
  }
  cVar6 = QRectF::contains((QRectF *)(local_b8 + 0x10));
  if (cVar6 != '\0') goto LAB_00663bc1;
  local_e8.xp._0_4_ = SUB84(local_68.xp,0);
  local_e8.xp._4_4_ = (undefined4)((ulong)local_68.xp >> 0x20);
  dVar7 = rect->w;
  if (dVar7 <= local_98) {
    if (local_78 <= local_98) {
      dVar7 = local_88.xp;
      if (local_88.xp <= (double)local_b8._16_8_) {
        if (local_98 + (double)local_b8._16_8_ <= local_78 + local_88.xp) goto LAB_00663adb;
        dVar12 = (local_78 + local_88.xp) - dVar8;
        goto LAB_00663a71;
      }
    }
    else {
      dVar7 = (dVar7 * 0.5 + rect->xp) - local_98 * 0.5;
    }
LAB_00663ad5:
    local_e8.xp._0_4_ = SUB84(dVar7,0);
    local_e8.xp._4_4_ = (undefined4)((ulong)dVar7 >> 0x20);
  }
  else {
    dVar12 = rect->xp;
    if (dVar12 <= (double)local_b8._16_8_) {
      if (dVar7 + dVar12 < local_98 + (double)local_b8._16_8_) {
        dVar7 = (dVar7 + dVar12) - dVar8;
        goto LAB_00663ad5;
      }
    }
    else {
LAB_00663a71:
      local_e8.xp._0_4_ = SUB84(dVar12,0);
      local_e8.xp._4_4_ = (undefined4)((ulong)dVar12 >> 0x20);
    }
  }
LAB_00663adb:
  dVar7 = (double)CONCAT44(local_e8.xp._4_4_,local_e8.xp._0_4_);
  dVar8 = rect->h;
  qVar3 = local_68.yp;
  if (dVar8 <= dStack_90) {
    if (dStack_70 <= dStack_90) {
      qVar3 = local_88.yp;
      if ((local_88.yp <= qStack_a0) &&
         (dVar7 = (double)CONCAT44(local_e8.xp._4_4_,local_e8.xp._0_4_), qVar3 = local_68.yp,
         dStack_70 + local_88.yp < dStack_90 + qStack_a0)) {
        dVar7 = (double)CONCAT44(local_e8.xp._4_4_,local_e8.xp._0_4_);
        qVar3 = (dStack_70 + local_88.yp) - dVar2;
      }
    }
    else {
      qVar3 = (dVar8 * 0.5 + rect->yp) - dStack_90 * 0.5;
    }
  }
  else {
    dVar7 = rect->yp;
    if ((dVar7 <= qStack_a0) &&
       (dVar8 = dVar8 + dVar7, dVar7 = (double)CONCAT44(local_e8.xp._4_4_,local_e8.xp._0_4_),
       dVar8 < dStack_90 + qStack_a0)) {
      dVar7 = dVar8 - dVar2;
    }
  }
  local_e8.yp._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
  local_e8.yp._0_4_ = SUB84(qVar3,0);
  auVar11._0_8_ = (this_00->contentPosRange).xp;
  auVar11._8_8_ = (this_00->contentPosRange).yp;
  auVar9._0_8_ = (this_00->contentPosRange).w + (double)auVar11._0_8_;
  auVar9._8_8_ = (this_00->contentPosRange).h + (double)auVar11._8_8_;
  auVar10._8_4_ = local_e8.yp._0_4_;
  auVar10._0_8_ = dVar7;
  auVar10._12_4_ = local_e8.yp._4_4_;
  auVar10 = minpd(auVar9,auVar10);
  auVar11 = maxpd(auVar10,auVar11);
  local_e8.xp._0_4_ = auVar11._0_4_;
  local_e8.xp._4_4_ = auVar11._4_4_;
  local_e8.yp._0_4_ = auVar11._8_4_;
  local_e8.yp._4_4_ = auVar11._12_4_;
  bVar5 = qFuzzyCompare(&local_e8,&local_68);
  if (!bVar5) {
    scrollTo(this,&local_e8,scrollTime);
  }
LAB_00663bc1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScroller::ensureVisible(const QRectF &rect, qreal xmargin, qreal ymargin, int scrollTime)
{
    Q_D(QScroller);

    if (d->state == Pressed || d->state == Dragging )
        return;

    if (d->state == Inactive && !d->prepareScrolling(QPointF()))
        return;

    // -- calculate the current pos (or the position after the current scroll)
    QPointF startPos(d->scrollingSegmentsEndPos(Qt::Horizontal),
                     d->scrollingSegmentsEndPos(Qt::Vertical));

    QRectF marginRect(rect.x() - xmargin, rect.y() - ymargin,
                      rect.width() + 2 * xmargin, rect.height() + 2 * ymargin);

    QSizeF visible = d->viewportSize;
    QRectF visibleRect(startPos, visible);

    qCDebug(lcScroller) << "QScroller::ensureVisible(" << rect << " [pix], " << xmargin
                        << " [pix], " << ymargin << " [pix], " << scrollTime << "[ms])";
    qCDebug(lcScroller) << "  --> content position:" << d->contentPosition;

    if (visibleRect.contains(marginRect))
        return;

    QPointF newPos = startPos;

    if (visibleRect.width() < rect.width()) {
        // at least try to move the rect into view
        if (rect.left() > visibleRect.left())
            newPos.setX(rect.left());
        else if (rect.right() < visibleRect.right())
            newPos.setX(rect.right() - visible.width());

    } else if (visibleRect.width() < marginRect.width()) {
        newPos.setX(rect.center().x() - visibleRect.width() / 2);
    } else if (marginRect.left() > visibleRect.left()) {
        newPos.setX(marginRect.left());
    } else if (marginRect.right() < visibleRect.right()) {
        newPos.setX(marginRect.right() - visible.width());
    }

    if (visibleRect.height() < rect.height()) {
        // at least try to move the rect into view
        if (rect.top() > visibleRect.top())
            newPos.setX(rect.top());
        else if (rect.bottom() < visibleRect.bottom())
            newPos.setX(rect.bottom() - visible.height());

    } else if (visibleRect.height() < marginRect.height()) {
        newPos.setY(rect.center().y() - visibleRect.height() / 2);
    } else if (marginRect.top() > visibleRect.top()) {
        newPos.setY(marginRect.top());
    } else if (marginRect.bottom() < visibleRect.bottom()) {
        newPos.setY(marginRect.bottom() - visible.height());
    }

    // clamp to maximum content position
    newPos = clampToRect(newPos, d->contentPosRange);
    if (newPos == startPos)
        return;

    scrollTo(newPos, scrollTime);
}